

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O1

LPWSTR __thiscall AutoString::GetWideString(AutoString *this,charcount_t *destCount)

{
  LPWSTR pWVar1;
  size_t *in_R9;
  charcount_t local_1c [2];
  charcount_t tempDestCount;
  
  if (this->data_wide != (LPWSTR)0x0) {
    return this->data_wide;
  }
  pWVar1 = (LPWSTR)0x0;
  if ((utf8 *)this->data != (utf8 *)0x0) {
    utf8::NarrowStringToWide<utf8::malloc_allocator>
              ((utf8 *)this->data,(LPCSTR)this->length,(size_t)&this->data_wide,(LPWSTR *)local_1c,
               (charcount_t *)0x0,in_R9);
    if (destCount != (charcount_t *)0x0) {
      *destCount = local_1c[0];
    }
    pWVar1 = this->data_wide;
  }
  return pWVar1;
}

Assistant:

LPWSTR GetWideString(charcount_t* destCount = nullptr)
    {
        if(data_wide || !data)
        {
            return data_wide;
        }
        charcount_t tempDestCount;
        utf8::NarrowStringToWide<utf8::malloc_allocator>(data, length, &data_wide, &tempDestCount);

        if (destCount)
        {
            *destCount = tempDestCount;
        }
        return data_wide;
    }